

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc40;
  double *in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc54;
  float in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  float in_stack_fffffffffffffc60;
  float fVar3;
  value_type in_stack_fffffffffffffc64;
  key_type in_stack_fffffffffffffc68;
  Type in_stack_fffffffffffffc6c;
  hasher *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffc80;
  float local_36c;
  float local_35c;
  float in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcbc;
  float in_stack_fffffffffffffcc0;
  float in_stack_fffffffffffffcc4;
  float local_338;
  AssertionResult local_2c0 [2];
  size_type local_2a0;
  AssertionResult local_298 [3];
  value_type local_260;
  key_type local_25c;
  Type local_258;
  int local_254;
  float local_23c;
  AssertionResult local_238 [2];
  float local_214;
  undefined8 local_210;
  AssertionResult local_208;
  float local_1f4;
  size_type local_1e0;
  AssertionResult local_1d8 [2];
  size_type local_1b8;
  AssertionResult local_1b0 [3];
  value_type local_174;
  int local_170;
  key_type local_16c;
  value_type local_13c;
  size_type local_138;
  float local_11c;
  undefined8 local_118;
  AssertionResult local_110 [2];
  float local_ec;
  AssertionResult local_e8;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  Hasher local_b8;
  Hasher local_ac [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher(local_ac,0);
    Hasher::Hasher(&local_b8,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              (in_stack_fffffffffffffc80,
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               in_stack_fffffffffffffc70,
               (key_equal *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    local_d8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffc40,
                      (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::max_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                      (float)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::min_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                      (float)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    local_ec = google::
               HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::max_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                  *)in_stack_fffffffffffffc40);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (float *)in_stack_fffffffffffffc48,(float *)in_stack_fffffffffffffc40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    local_338 = in_stack_fffffffffffffcb8;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      testing::AssertionResult::failure_message((AssertionResult *)0xca9442);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xca94a5);
      local_338 = in_stack_fffffffffffffcb8;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca9516);
    local_118 = 0;
    local_11c = google::
                HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::min_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffc40);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc48,(float *)in_stack_fffffffffffffc40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      testing::AssertionResult::failure_message((AssertionResult *)0xca95bf);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,local_338));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xca9622);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca9693);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffc40,
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    local_138 = google::
                BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca96b4);
    local_13c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (value_type *)CONCAT44(in_stack_fffffffffffffcbc,local_338));
    local_16c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffc40,
            (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    local_170 = 2;
    while( true ) {
      local_174 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (value_type *)CONCAT44(in_stack_fffffffffffffcbc,local_338));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xca97a6);
      in_stack_fffffffffffffcc4 = (float)(long)sVar2;
      local_338 = (float)sVar2;
      in_stack_fffffffffffffcbc = (float)(long)local_138;
      in_stack_fffffffffffffcc0 = (float)local_138;
      if (local_14 <= local_338 / in_stack_fffffffffffffcc0) break;
      local_1b8 = google::
                  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xca987f);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (unsigned_long *)in_stack_fffffffffffffc48,
                 (unsigned_long *)in_stack_fffffffffffffc40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc70);
        testing::AssertionResult::failure_message((AssertionResult *)0xca98fa);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                   (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (int)in_stack_fffffffffffffc5c,
                   (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (Message *)CONCAT44(in_stack_fffffffffffffcbc,local_338));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
        testing::Message::~Message((Message *)0xca9957);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xca99c2);
      local_170 = local_170 + 1;
    }
    local_1e0 = google::
                BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca99e6);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (unsigned_long *)in_stack_fffffffffffffc48,(unsigned_long *)in_stack_fffffffffffffc40
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
    in_stack_fffffffffffffcb8 = local_338;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      testing::AssertionResult::failure_message((AssertionResult *)0xca9a4f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,local_338));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xca9aac);
      in_stack_fffffffffffffcb8 = local_338;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca9b17);
    sVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xca9b55);
    local_35c = (float)sVar2;
    sVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xca9ba4);
    local_36c = (float)sVar2;
    local_1f4 = local_35c / local_36c + -0.01;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              ((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
    local_210 = 0x3ff0000000000000;
    local_214 = google::
                HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::max_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffc40);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc48,(float *)in_stack_fffffffffffffc40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc80 =
           (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xca9cb6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xca9d13);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca9d81);
    in_stack_fffffffffffffc7c =
         google::
         HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::min_load_factor((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffc40);
    local_23c = in_stack_fffffffffffffc7c;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (float *)in_stack_fffffffffffffc48,(float *)in_stack_fffffffffffffc40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_238);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc70 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xca9e18);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xca9e75);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca9ee6);
    local_138 = google::
                BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca9ef3);
    local_254 = 2;
    while( true ) {
      in_stack_fffffffffffffc6c =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
      local_258 = in_stack_fffffffffffffc6c;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffc40,
              (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      in_stack_fffffffffffffc68 =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
      local_25c = in_stack_fffffffffffffc68;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffc40,
              (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      in_stack_fffffffffffffc64 =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffc40,(int)in_stack_fffffffffffffc3c);
      local_260 = in_stack_fffffffffffffc64;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (value_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xca9fd3);
      in_stack_fffffffffffffc5c = (float)(long)sVar2;
      in_stack_fffffffffffffc50 = (float)sVar2;
      in_stack_fffffffffffffc54 = (float)(long)local_138;
      in_stack_fffffffffffffc58 = (float)local_138;
      if (in_stack_fffffffffffffc50 / in_stack_fffffffffffffc58 <= local_1f4) break;
      fVar3 = in_stack_fffffffffffffc50;
      local_2a0 = google::
                  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcaa084);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (unsigned_long *)in_stack_fffffffffffffc48,
                 (unsigned_long *)in_stack_fffffffffffffc40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc70);
        in_stack_fffffffffffffc48 =
             (double *)testing::AssertionResult::failure_message((AssertionResult *)0xcaa0ff);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                   (char *)CONCAT44(in_stack_fffffffffffffc64,fVar3),(int)in_stack_fffffffffffffc5c,
                   (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (Message *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
        testing::Message::~Message((Message *)0xcaa15c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaa1c7);
      local_254 = local_254 + 1;
    }
    in_stack_fffffffffffffc60 = in_stack_fffffffffffffc50;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcaa1eb);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (unsigned_long *)in_stack_fffffffffffffc48,(unsigned_long *)in_stack_fffffffffffffc40
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc40 =
           (HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xcaa254);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (int)in_stack_fffffffffffffc5c,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Message *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
      testing::Message::~Message((Message *)0xcaa2b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaa31c);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xcaa352);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}